

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::InlinePass::FixDebugDeclare
          (InlinePass *this,Instruction *dbg_declare_inst,
          map<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
          *access_chains)

{
  Instruction *this_00;
  uint32_t uVar1;
  const_iterator cVar2;
  Operand *pOVar3;
  int i;
  uint32_t uVar4;
  initializer_list<unsigned_int> init_list;
  uint32_t local_b8;
  uint32_t var_id;
  _Base_ptr local_b0;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  Operand local_88;
  SmallVector<unsigned_int,_2UL> local_58;
  
  local_b0 = &(access_chains->_M_t)._M_impl.super__Rb_tree_header._M_header;
  while( true ) {
    var_id = Instruction::GetSingleWordInOperand(dbg_declare_inst,3);
    cVar2 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::_Select1st<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
            ::find(&access_chains->_M_t,&var_id);
    if (cVar2._M_node == local_b0) break;
    this_00 = (Instruction *)cVar2._M_node[1]._M_parent;
    operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar4 = 0; uVar4 != 3; uVar4 = uVar4 + 1) {
      pOVar3 = Instruction::GetInOperand(dbg_declare_inst,uVar4);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                (&operands,pOVar3);
    }
    local_b8 = Instruction::GetSingleWordInOperand(this_00,0);
    init_list._M_len = 1;
    init_list._M_array = &local_b8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
    local_88.type = SPV_OPERAND_TYPE_ID;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&operands,&local_88);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
    pOVar3 = Instruction::GetInOperand(dbg_declare_inst,4);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
              (&operands,pOVar3);
    uVar4 = 1;
    while( true ) {
      uVar1 = Instruction::NumInOperands(this_00);
      if (uVar1 <= uVar4) break;
      pOVar3 = Instruction::GetInOperand(this_00,uVar4);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                (&operands,pOVar3);
      uVar4 = uVar4 + 1;
    }
    uVar4 = 5;
    while( true ) {
      uVar1 = Instruction::NumInOperands(dbg_declare_inst);
      if (uVar1 <= uVar4) break;
      pOVar3 = Instruction::GetInOperand(dbg_declare_inst,uVar4);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                (&operands,pOVar3);
      uVar4 = uVar4 + 1;
    }
    Instruction::SetInOperands(dbg_declare_inst,&operands);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&operands)
    ;
  }
  return;
}

Assistant:

void InlinePass::FixDebugDeclare(
    Instruction* dbg_declare_inst,
    const std::map<uint32_t, Instruction*>& access_chains) {
  do {
    uint32_t var_id =
        dbg_declare_inst->GetSingleWordInOperand(kSpvDebugDeclareVarInIdx);

    // The def-use chains are not kept up to date while inlining, so we need to
    // get the variable by traversing the functions.
    auto it = access_chains.find(var_id);
    if (it == access_chains.end()) {
      return;
    }
    Instruction* access_chain = it->second;

    // If the variable id in the debug declare is an access chain, it is
    // invalid. it needs to be fixed up. The debug declare will be updated so
    // that its Var operand becomes the base of the access chain. The indexes of
    // the access chain are prepended before the indexes of the debug declare.

    std::vector<Operand> operands;
    for (int i = 0; i < kSpvDebugDeclareVarInIdx; i++) {
      operands.push_back(dbg_declare_inst->GetInOperand(i));
    }

    uint32_t access_chain_base =
        access_chain->GetSingleWordInOperand(kSpvAccessChainBaseInIdx);
    operands.push_back(Operand(SPV_OPERAND_TYPE_ID, {access_chain_base}));
    operands.push_back(
        dbg_declare_inst->GetInOperand(kSpvDebugDeclareVarInIdx + 1));

    for (uint32_t i = kSpvAccessChainBaseInIdx + 1;
         i < access_chain->NumInOperands(); ++i) {
      operands.push_back(access_chain->GetInOperand(i));
    }

    for (uint32_t i = kSpvDebugDeclareVarInIdx + 2;
         i < dbg_declare_inst->NumInOperands(); ++i) {
      operands.push_back(dbg_declare_inst->GetInOperand(i));
    }

    dbg_declare_inst->SetInOperands(std::move(operands));
  } while (true);
}